

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorwiseOp.h
# Opt level: O0

void __thiscall
Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::normalize
          (VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *this)

{
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,_const_Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_Eigen::internal::member_norm<double>,_1>,_1,_3>_>
  local_38;
  VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *local_10;
  VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *this_local;
  
  local_10 = this;
  normalized(&local_38,this);
  Matrix<double,-1,3,0,-1,3>::operator=
            ((Matrix<double,_1,3,0,_1,3> *)this->m_matrix,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,_const_Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_Eigen::internal::member_norm<double>,_1>,_1,_3>_>_>
              *)&local_38);
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_const_Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_Eigen::internal::member_norm<double>,_1>,_1,_3>_>
  ::~CwiseBinaryOp(&local_38);
  return;
}

Assistant:

void normalize() {
      m_matrix = this->normalized();
    }